

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlChar * xmlParseAttValueComplex(xmlParserCtxtPtr ctxt,int *attlen,int normalize)

{
  long lVar1;
  size_t sVar2;
  int iVar3;
  size_t sVar4;
  xmlChar *pxVar5;
  xmlEntityPtr pxVar6;
  bool bVar7;
  bool bVar8;
  size_t new_size_8;
  xmlChar *tmp_8;
  size_t new_size_7;
  xmlChar *tmp_7;
  size_t new_size_6;
  xmlChar *tmp_6;
  unsigned_long diff;
  unsigned_long oldnbent;
  xmlChar *cur;
  int i;
  size_t new_size_5;
  xmlChar *tmp_5;
  size_t new_size_4;
  xmlChar *tmp_4;
  size_t new_size_3;
  xmlChar *tmp_3;
  size_t new_size_2;
  xmlChar *tmp_2;
  size_t new_size_1;
  xmlChar *tmp_1;
  size_t new_size;
  xmlChar *tmp;
  int val;
  xmlEntityPtr ent;
  xmlChar *current;
  int local_58;
  int in_space;
  int l;
  int c;
  size_t maxLength;
  size_t buf_size;
  size_t len;
  xmlChar *rep;
  xmlChar *buf;
  xmlChar limit;
  int *piStack_20;
  int normalize_local;
  int *attlen_local;
  xmlParserCtxtPtr ctxt_local;
  
  buf._3_1_ = 0;
  rep = (xmlChar *)0x0;
  len = 0;
  buf_size = 0;
  maxLength = 0;
  iVar3 = 10000000;
  if ((ctxt->options & 0x80000U) != 0) {
    iVar3 = 1000000000;
  }
  _l = (ulong)iVar3;
  bVar8 = false;
  buf._4_4_ = normalize;
  piStack_20 = attlen;
  attlen_local = (int *)ctxt;
  if (*ctxt->input->cur == '\"') {
    ctxt->instate = XML_PARSER_ATTRIBUTE_VALUE;
    buf._3_1_ = '\"';
    xmlNextChar(ctxt);
  }
  else {
    if (*ctxt->input->cur != '\'') {
      xmlFatalErr(ctxt,XML_ERR_ATTRIBUTE_NOT_STARTED,(char *)0x0);
      return (xmlChar *)0x0;
    }
    buf._3_1_ = '\'';
    ctxt->instate = XML_PARSER_ATTRIBUTE_VALUE;
    xmlNextChar(ctxt);
  }
  maxLength = 100;
  rep = (xmlChar *)(*xmlMallocAtomic)(100);
  if (rep != (xmlChar *)0x0) {
    in_space = xmlCurrentChar((xmlParserCtxtPtr)attlen_local,&local_58);
    do {
      bVar7 = false;
      if (**(char **)(*(long *)(attlen_local + 0xe) + 0x20) != buf._3_1_) {
        if (in_space < 0x100) {
          if (((8 < in_space) && (in_space < 0xb)) ||
             ((in_space == 0xd || (bVar7 = false, 0x1f < in_space)))) {
LAB_0018a2a9:
            bVar7 = false;
            if (in_space != 0x3c) {
              bVar7 = attlen_local[0x44] != -1;
            }
          }
        }
        else if ((((0xff < in_space) && (in_space < 0xd800)) ||
                 ((0xdfff < in_space && (in_space < 0xfffe)))) ||
                ((bVar7 = false, 0xffff < in_space && (bVar7 = false, in_space < 0x110000))))
        goto LAB_0018a2a9;
      }
      if (!bVar7) {
        if (attlen_local[0x44] != -1) {
          if ((bVar8) && (buf._4_4_ != 0)) {
            while( true ) {
              bVar8 = false;
              if (buf_size != 0) {
                bVar8 = rep[buf_size - 1] == ' ';
              }
              if (!bVar8) break;
              buf_size = buf_size - 1;
            }
          }
          rep[buf_size] = '\0';
          if (**(char **)(*(long *)(attlen_local + 0xe) + 0x20) == '<') {
            xmlFatalErr((xmlParserCtxtPtr)attlen_local,XML_ERR_LT_IN_ATTRIBUTE,(char *)0x0);
            goto LAB_0018af4f;
          }
          if (**(char **)(*(long *)(attlen_local + 0xe) + 0x20) == buf._3_1_) {
            xmlNextChar((xmlParserCtxtPtr)attlen_local);
            goto LAB_0018af4f;
          }
          if (in_space == 0) {
LAB_0018af2d:
            xmlFatalErrMsg((xmlParserCtxtPtr)attlen_local,XML_ERR_ATTRIBUTE_NOT_FINISHED,
                           "AttValue: \' expected\n");
          }
          else {
            if (in_space < 0x100) {
              if (((8 < in_space) && (in_space < 0xb)) || ((in_space == 0xd || (0x1f < in_space))))
              goto LAB_0018af2d;
            }
            else if ((((0xff < in_space) && (in_space < 0xd800)) ||
                     ((0xdfff < in_space && (in_space < 0xfffe)))) ||
                    ((0xffff < in_space && (in_space < 0x110000)))) goto LAB_0018af2d;
            xmlFatalErrMsg((xmlParserCtxtPtr)attlen_local,XML_ERR_INVALID_CHAR,
                           "invalid character in attribute value\n");
          }
LAB_0018af4f:
          if (piStack_20 != (int *)0x0) {
            *piStack_20 = (int)buf_size;
          }
          return rep;
        }
        goto LAB_0018af79;
      }
      if (in_space == 0x26) {
        bVar8 = false;
        if (*(char *)(*(long *)(*(long *)(attlen_local + 0xe) + 0x20) + 1) == '#') {
          iVar3 = xmlParseCharRef((xmlParserCtxtPtr)attlen_local);
          if (iVar3 == 0x26) {
            if (attlen_local[7] == 0) {
              sVar4 = maxLength;
              pxVar5 = rep;
              if ((maxLength < buf_size + 10) &&
                 ((sVar4 = maxLength * 2 + 10, sVar4 < maxLength ||
                  (pxVar5 = (xmlChar *)(*xmlRealloc)(rep,sVar4), pxVar5 == (xmlChar *)0x0))))
              goto LAB_0018af6c;
              rep = pxVar5;
              maxLength = sVar4;
              builtin_memcpy(rep + buf_size,"&#38;",5);
              buf_size = buf_size + 5;
            }
            else {
              sVar4 = maxLength;
              pxVar5 = rep;
              if ((maxLength < buf_size + 10) &&
                 ((sVar4 = maxLength * 2 + 10, sVar4 < maxLength ||
                  (pxVar5 = (xmlChar *)(*xmlRealloc)(rep,sVar4), pxVar5 == (xmlChar *)0x0))))
              goto LAB_0018af6c;
              rep = pxVar5;
              maxLength = sVar4;
              rep[buf_size] = '&';
              buf_size = buf_size + 1;
            }
          }
          else if (iVar3 != 0) {
            sVar4 = maxLength;
            pxVar5 = rep;
            if ((maxLength < buf_size + 10) &&
               ((sVar4 = maxLength * 2 + 10, sVar4 < maxLength ||
                (pxVar5 = (xmlChar *)(*xmlRealloc)(rep,sVar4), pxVar5 == (xmlChar *)0x0))))
            goto LAB_0018af6c;
            rep = pxVar5;
            maxLength = sVar4;
            iVar3 = xmlCopyChar(0,rep + buf_size,iVar3);
            buf_size = (long)iVar3 + buf_size;
          }
        }
        else {
          pxVar6 = xmlParseEntityRef((xmlParserCtxtPtr)attlen_local);
          *(long *)(attlen_local + 0xae) = *(long *)(attlen_local + 0xae) + 1;
          if ((pxVar6 == (xmlEntityPtr)0x0) ||
             (*(long *)(attlen_local + 0xae) = (long)pxVar6->owner + *(long *)(attlen_local + 0xae),
             pxVar6->etype != XML_INTERNAL_PREDEFINED_ENTITY)) {
            if ((pxVar6 == (xmlEntityPtr)0x0) || (attlen_local[7] == 0)) {
              if (pxVar6 != (xmlEntityPtr)0x0) {
                cur._4_4_ = xmlStrlen(pxVar6->name);
                oldnbent = (unsigned_long)pxVar6->name;
                if (((pxVar6->etype != XML_INTERNAL_PREDEFINED_ENTITY) &&
                    (pxVar6->content != (xmlChar *)0x0)) && (pxVar6->checked == 0)) {
                  lVar1 = *(long *)(attlen_local + 0xae);
                  attlen_local[0x62] = attlen_local[0x62] + 1;
                  len = (size_t)xmlStringDecodeEntities
                                          ((xmlParserCtxtPtr)attlen_local,pxVar6->content,1,'\0',
                                           '\0','\0');
                  attlen_local[0x62] = attlen_local[0x62] + -1;
                  tmp_6 = (xmlChar *)((*(long *)(attlen_local + 0xae) - lVar1) + 1);
                  if ((xmlChar *)0x3fffffff < tmp_6) {
                    tmp_6 = (xmlChar *)0x3fffffff;
                  }
                  pxVar6->checked = (int)((long)tmp_6 << 1);
                  if ((xmlChar *)len == (xmlChar *)0x0) {
                    *pxVar6->content = '\0';
                  }
                  else {
                    pxVar5 = xmlStrchr((xmlChar *)len,'<');
                    if (pxVar5 != (xmlChar *)0x0) {
                      pxVar6->checked = pxVar6->checked | 1;
                    }
                    (*xmlFree)((void *)len);
                  }
                  len = 0;
                }
                rep[buf_size] = '&';
                sVar4 = maxLength;
                buf_size = buf_size + 1;
                pxVar5 = rep;
                while (rep = pxVar5, maxLength = sVar4, maxLength < buf_size + (long)cur._4_4_ + 10)
                {
                  sVar4 = maxLength * 2 + (long)cur._4_4_ + 10;
                  if ((sVar4 < maxLength) ||
                     (pxVar5 = (xmlChar *)(*xmlRealloc)(rep,sVar4), pxVar5 == (xmlChar *)0x0))
                  goto LAB_0018af6c;
                }
                for (; 0 < cur._4_4_; cur._4_4_ = cur._4_4_ + -1) {
                  rep[buf_size] = *(xmlChar *)oldnbent;
                  oldnbent = oldnbent + 1;
                  buf_size = buf_size + 1;
                }
                rep[buf_size] = ';';
                buf_size = buf_size + 1;
              }
            }
            else if (pxVar6->etype == XML_INTERNAL_PREDEFINED_ENTITY) {
              sVar4 = maxLength;
              pxVar5 = rep;
              if ((maxLength < buf_size + 10) &&
                 ((sVar4 = maxLength * 2 + 10, sVar4 < maxLength ||
                  (pxVar5 = (xmlChar *)(*xmlRealloc)(rep,sVar4), pxVar5 == (xmlChar *)0x0))))
              goto LAB_0018af6c;
              rep = pxVar5;
              maxLength = sVar4;
              if (pxVar6->content != (xmlChar *)0x0) {
                rep[buf_size] = *pxVar6->content;
                buf_size = buf_size + 1;
              }
            }
            else {
              attlen_local[0x62] = attlen_local[0x62] + 1;
              ent = (xmlEntityPtr)
                    xmlStringDecodeEntities
                              ((xmlParserCtxtPtr)attlen_local,pxVar6->content,1,'\0','\0','\0');
              attlen_local[0x62] = attlen_local[0x62] + -1;
              sVar4 = maxLength;
              len = (size_t)ent;
              pxVar5 = rep;
              if (ent != (xmlEntityPtr)0x0) {
                while (rep = pxVar5, maxLength = sVar4, sVar2 = buf_size,
                      *(char *)&ent->_private != '\0') {
                  if (((*(char *)&ent->_private == '\r') || (*(char *)&ent->_private == '\n')) ||
                     (*(char *)&ent->_private == '\t')) {
                    rep[buf_size] = ' ';
                  }
                  else {
                    rep[buf_size] = *(xmlChar *)&ent->_private;
                  }
                  buf_size = buf_size + 1;
                  ent = (xmlEntityPtr)((long)&ent->_private + 1);
                  sVar4 = maxLength;
                  pxVar5 = rep;
                  if ((maxLength < sVar2 + 0xb) &&
                     ((sVar4 = maxLength * 2 + 10, sVar4 < maxLength ||
                      (pxVar5 = (xmlChar *)(*xmlRealloc)(rep,sVar4), pxVar5 == (xmlChar *)0x0))))
                  goto LAB_0018af6c;
                }
                (*xmlFree)((void *)len);
                len = 0;
              }
            }
          }
          else {
            sVar4 = maxLength;
            pxVar5 = rep;
            if ((maxLength < buf_size + 10) &&
               ((sVar4 = maxLength * 2 + 10, sVar4 < maxLength ||
                (pxVar5 = (xmlChar *)(*xmlRealloc)(rep,sVar4), pxVar5 == (xmlChar *)0x0))))
            goto LAB_0018af6c;
            rep = pxVar5;
            maxLength = sVar4;
            if ((attlen_local[7] == 0) && (*pxVar6->content == '&')) {
              builtin_memcpy(rep + buf_size,"&#38;",5);
              buf_size = buf_size + 5;
            }
            else {
              rep[buf_size] = *pxVar6->content;
              buf_size = buf_size + 1;
            }
          }
        }
      }
      else {
        if ((((in_space == 0x20) || (in_space == 0xd)) || (in_space == 10)) || (in_space == 9)) {
          if ((buf_size != 0) || (sVar4 = maxLength, pxVar5 = rep, buf._4_4_ == 0)) {
            if ((buf._4_4_ == 0) || (!bVar8)) {
              if (local_58 == 1) {
                rep[buf_size] = ' ';
                sVar4 = maxLength;
                buf_size = buf_size + 1;
                pxVar5 = rep;
              }
              else {
                iVar3 = xmlCopyCharMultiByte(rep + buf_size,0x20);
                buf_size = (long)iVar3 + buf_size;
                sVar4 = maxLength;
                pxVar5 = rep;
              }
              while (rep = pxVar5, maxLength = sVar4, maxLength < buf_size + 10) {
                sVar4 = maxLength * 2 + 10;
                if ((sVar4 < maxLength) ||
                   (pxVar5 = (xmlChar *)(*xmlRealloc)(rep,sVar4), pxVar5 == (xmlChar *)0x0))
                goto LAB_0018af6c;
              }
            }
            bVar8 = true;
            sVar4 = maxLength;
            pxVar5 = rep;
          }
        }
        else {
          bVar8 = false;
          if (local_58 == 1) {
            rep[buf_size] = (xmlChar)in_space;
            buf_size = buf_size + 1;
          }
          else {
            iVar3 = xmlCopyCharMultiByte(rep + buf_size,in_space);
            buf_size = (long)iVar3 + buf_size;
          }
          sVar4 = maxLength;
          pxVar5 = rep;
          if ((maxLength < buf_size + 10) &&
             ((sVar4 = maxLength * 2 + 10, sVar4 < maxLength ||
              (pxVar5 = (xmlChar *)(*xmlRealloc)(rep,sVar4), pxVar5 == (xmlChar *)0x0))))
          goto LAB_0018af6c;
        }
        rep = pxVar5;
        maxLength = sVar4;
        if (**(char **)(*(long *)(attlen_local + 0xe) + 0x20) == '\n') {
          *(int *)(*(long *)(attlen_local + 0xe) + 0x34) =
               *(int *)(*(long *)(attlen_local + 0xe) + 0x34) + 1;
          *(undefined4 *)(*(long *)(attlen_local + 0xe) + 0x38) = 1;
        }
        else {
          *(int *)(*(long *)(attlen_local + 0xe) + 0x38) =
               *(int *)(*(long *)(attlen_local + 0xe) + 0x38) + 1;
        }
        *(long *)(*(long *)(attlen_local + 0xe) + 0x20) =
             *(long *)(*(long *)(attlen_local + 0xe) + 0x20) + (long)local_58;
      }
      if ((attlen_local[0x71] == 0) &&
         (*(long *)(*(long *)(attlen_local + 0xe) + 0x28) -
          *(long *)(*(long *)(attlen_local + 0xe) + 0x20) < 0xfa)) {
        xmlGROW((xmlParserCtxtPtr)attlen_local);
      }
      in_space = xmlCurrentChar((xmlParserCtxtPtr)attlen_local,&local_58);
    } while (buf_size <= _l);
    xmlFatalErrMsg((xmlParserCtxtPtr)attlen_local,XML_ERR_ATTRIBUTE_NOT_FINISHED,
                   "AttValue length too long\n");
  }
LAB_0018af6c:
  xmlErrMemory((xmlParserCtxtPtr)attlen_local,(char *)0x0);
LAB_0018af79:
  if (rep != (xmlChar *)0x0) {
    (*xmlFree)(rep);
  }
  if (len != 0) {
    (*xmlFree)((void *)len);
  }
  return (xmlChar *)0x0;
}

Assistant:

static xmlChar *
xmlParseAttValueComplex(xmlParserCtxtPtr ctxt, int *attlen, int normalize) {
    xmlChar limit = 0;
    xmlChar *buf = NULL;
    xmlChar *rep = NULL;
    size_t len = 0;
    size_t buf_size = 0;
    size_t maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                       XML_MAX_HUGE_LENGTH :
                       XML_MAX_TEXT_LENGTH;
    int c, l, in_space = 0;
    xmlChar *current = NULL;
    xmlEntityPtr ent;

    if (NXT(0) == '"') {
	ctxt->instate = XML_PARSER_ATTRIBUTE_VALUE;
	limit = '"';
        NEXT;
    } else if (NXT(0) == '\'') {
	limit = '\'';
	ctxt->instate = XML_PARSER_ATTRIBUTE_VALUE;
        NEXT;
    } else {
	xmlFatalErr(ctxt, XML_ERR_ATTRIBUTE_NOT_STARTED, NULL);
	return(NULL);
    }

    /*
     * allocate a translation buffer.
     */
    buf_size = XML_PARSER_BUFFER_SIZE;
    buf = (xmlChar *) xmlMallocAtomic(buf_size);
    if (buf == NULL) goto mem_error;

    /*
     * OK loop until we reach one of the ending char or a size limit.
     */
    c = CUR_CHAR(l);
    while (((NXT(0) != limit) && /* checked */
            (IS_CHAR(c)) && (c != '<')) &&
            (ctxt->instate != XML_PARSER_EOF)) {
	if (c == '&') {
	    in_space = 0;
	    if (NXT(1) == '#') {
		int val = xmlParseCharRef(ctxt);

		if (val == '&') {
		    if (ctxt->replaceEntities) {
			if (len + 10 > buf_size) {
			    growBuffer(buf, 10);
			}
			buf[len++] = '&';
		    } else {
			/*
			 * The reparsing will be done in xmlStringGetNodeList()
			 * called by the attribute() function in SAX.c
			 */
			if (len + 10 > buf_size) {
			    growBuffer(buf, 10);
			}
			buf[len++] = '&';
			buf[len++] = '#';
			buf[len++] = '3';
			buf[len++] = '8';
			buf[len++] = ';';
		    }
		} else if (val != 0) {
		    if (len + 10 > buf_size) {
			growBuffer(buf, 10);
		    }
		    len += xmlCopyChar(0, &buf[len], val);
		}
	    } else {
		ent = xmlParseEntityRef(ctxt);
		ctxt->nbentities++;
		if (ent != NULL)
		    ctxt->nbentities += ent->owner;
		if ((ent != NULL) &&
		    (ent->etype == XML_INTERNAL_PREDEFINED_ENTITY)) {
		    if (len + 10 > buf_size) {
			growBuffer(buf, 10);
		    }
		    if ((ctxt->replaceEntities == 0) &&
		        (ent->content[0] == '&')) {
			buf[len++] = '&';
			buf[len++] = '#';
			buf[len++] = '3';
			buf[len++] = '8';
			buf[len++] = ';';
		    } else {
			buf[len++] = ent->content[0];
		    }
		} else if ((ent != NULL) &&
		           (ctxt->replaceEntities != 0)) {
		    if (ent->etype != XML_INTERNAL_PREDEFINED_ENTITY) {
			++ctxt->depth;
			rep = xmlStringDecodeEntities(ctxt, ent->content,
						      XML_SUBSTITUTE_REF,
						      0, 0, 0);
			--ctxt->depth;
			if (rep != NULL) {
			    current = rep;
			    while (*current != 0) { /* non input consuming */
                                if ((*current == 0xD) || (*current == 0xA) ||
                                    (*current == 0x9)) {
                                    buf[len++] = 0x20;
                                    current++;
                                } else
                                    buf[len++] = *current++;
				if (len + 10 > buf_size) {
				    growBuffer(buf, 10);
				}
			    }
			    xmlFree(rep);
			    rep = NULL;
			}
		    } else {
			if (len + 10 > buf_size) {
			    growBuffer(buf, 10);
			}
			if (ent->content != NULL)
			    buf[len++] = ent->content[0];
		    }
		} else if (ent != NULL) {
		    int i = xmlStrlen(ent->name);
		    const xmlChar *cur = ent->name;

		    /*
		     * This may look absurd but is needed to detect
		     * entities problems
		     */
		    if ((ent->etype != XML_INTERNAL_PREDEFINED_ENTITY) &&
			(ent->content != NULL) && (ent->checked == 0)) {
			unsigned long oldnbent = ctxt->nbentities, diff;

			++ctxt->depth;
			rep = xmlStringDecodeEntities(ctxt, ent->content,
						  XML_SUBSTITUTE_REF, 0, 0, 0);
			--ctxt->depth;

                        diff = ctxt->nbentities - oldnbent + 1;
                        if (diff > INT_MAX / 2)
                            diff = INT_MAX / 2;
                        ent->checked = diff * 2;
			if (rep != NULL) {
			    if (xmlStrchr(rep, '<'))
			        ent->checked |= 1;
			    xmlFree(rep);
			    rep = NULL;
			} else {
                            ent->content[0] = 0;
                        }
		    }

		    /*
		     * Just output the reference
		     */
		    buf[len++] = '&';
		    while (len + i + 10 > buf_size) {
			growBuffer(buf, i + 10);
		    }
		    for (;i > 0;i--)
			buf[len++] = *cur++;
		    buf[len++] = ';';
		}
	    }
	} else {
	    if ((c == 0x20) || (c == 0xD) || (c == 0xA) || (c == 0x9)) {
	        if ((len != 0) || (!normalize)) {
		    if ((!normalize) || (!in_space)) {
			COPY_BUF(l,buf,len,0x20);
			while (len + 10 > buf_size) {
			    growBuffer(buf, 10);
			}
		    }
		    in_space = 1;
		}
	    } else {
	        in_space = 0;
		COPY_BUF(l,buf,len,c);
		if (len + 10 > buf_size) {
		    growBuffer(buf, 10);
		}
	    }
	    NEXTL(l);
	}
	GROW;
	c = CUR_CHAR(l);
        if (len > maxLength) {
            xmlFatalErrMsg(ctxt, XML_ERR_ATTRIBUTE_NOT_FINISHED,
                           "AttValue length too long\n");
            goto mem_error;
        }
    }
    if (ctxt->instate == XML_PARSER_EOF)
        goto error;

    if ((in_space) && (normalize)) {
        while ((len > 0) && (buf[len - 1] == 0x20)) len--;
    }
    buf[len] = 0;
    if (RAW == '<') {
	xmlFatalErr(ctxt, XML_ERR_LT_IN_ATTRIBUTE, NULL);
    } else if (RAW != limit) {
	if ((c != 0) && (!IS_CHAR(c))) {
	    xmlFatalErrMsg(ctxt, XML_ERR_INVALID_CHAR,
			   "invalid character in attribute value\n");
	} else {
	    xmlFatalErrMsg(ctxt, XML_ERR_ATTRIBUTE_NOT_FINISHED,
			   "AttValue: ' expected\n");
        }
    } else
	NEXT;

    if (attlen != NULL) *attlen = len;
    return(buf);

mem_error:
    xmlErrMemory(ctxt, NULL);
error:
    if (buf != NULL)
        xmlFree(buf);
    if (rep != NULL)
        xmlFree(rep);
    return(NULL);
}